

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileScalarOperation::
     Finalize<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>>
               (ReservoirQuantileState<duckdb::hugeint_t> *state,hugeint_t *target,
               AggregateFinalizeData *finalize_data)

{
  hugeint_t *__first;
  int64_t iVar1;
  FunctionData *pFVar2;
  reference pvVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  if (state->pos != 0) {
    pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    __first = state->v;
    lVar5 = state->pos - 1;
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    pvVar3 = vector<double,_true>::get<true>((vector<double,_true> *)(pFVar2 + 8),0);
    dVar6 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * *pvVar3;
    uVar4 = (ulong)dVar6;
    uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    std::nth_element<duckdb::hugeint_t*>(__first,__first + uVar4,__first + state->pos);
    iVar1 = __first[uVar4].upper;
    target->lower = __first[uVar4].lower;
    target->upper = iVar1;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.v);
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();
		auto v_t = state.v;
		D_ASSERT(bind_data.quantiles.size() == 1);
		auto offset = (idx_t)((double)(state.pos - 1) * bind_data.quantiles[0]);
		std::nth_element(v_t, v_t + offset, v_t + state.pos);
		target = v_t[offset];
	}